

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_powertrain.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ChStreamOutAscii *pCVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Atomic_word *p_Var8;
  bool bVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  shared_ptr<chrono::ChShaft> my_shaftD;
  shared_ptr<chrono::ChShaft> my_shaftC;
  shared_ptr<chrono::ChShaftsTorqueConverter> my_torqueconverter;
  shared_ptr<chrono::ChShaft> my_shaftB;
  shared_ptr<chrono::ChShaftsThermalEngine> my_motor;
  shared_ptr<chrono::ChShaftsFreewheel> my_freewheel;
  shared_ptr<chrono::ChShaftsClutch> my_clutch;
  shared_ptr<chrono::ChShaft> my_shaftA;
  ChSystemNSC sys;
  ChShaft *local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_900;
  ChShaft *local_8f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_8f0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_8e0;
  ChShaftsTorqueConverter *local_8d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8d0;
  ChShaft *local_8c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8c0;
  ChShaftsThermalEngine *local_8b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_8b0 [2];
  double local_8a0;
  ChShaftsFreewheel *local_898;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_890;
  ChShaftsClutch *local_888;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_880;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_878;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_870;
  ChShaftsFreewheel *local_868;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_860;
  ChShaftsTorqueConverter *local_858;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_850;
  ChShaft *local_848;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  ChShaft *local_838;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_830;
  ChShaft *local_828;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_820;
  ChShaft *local_818;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_810;
  ChShaftsClutch *local_808;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_800;
  ChShaftsTorqueConverter *local_7f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7f0;
  ChShaft *local_7e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7e0;
  ChShaft *local_7d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7d0;
  ChShaft *local_7c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7c0;
  ChShaftsThermalEngine *local_7b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7b0;
  ChShaft *local_7a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_7a0;
  ChShaft *local_798;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_790;
  ChShaft *local_788;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_780;
  ChShaft *local_778;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_770;
  ChShaftsThermalEngine *local_768;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_760;
  ChShaft *local_758;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_750;
  ChShaft *local_748;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_740;
  ChShaftsTorqueConverter *local_738;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_730;
  ChShaft *local_728;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_720;
  ChShaft *local_718;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_710;
  ChShaft *local_708;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_700;
  ChShaft *local_6f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6b0;
  ChShaft *local_6a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_6a0 [89];
  ChStreamOutAscii local_3d8 [40];
  ChSystemNSC local_3b0 [8];
  ChStreamOutAscii local_3a8 [888];
  
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar6 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar6,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n\n");
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar6," Example 5: torque converter and thermal engine \n");
  chrono::ChSystemNSC::ChSystemNSC(local_3b0,true);
  local_6a8 = (ChShaft *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (a_Stack_6a0,&local_6a8,(allocator<chrono::ChShaft> *)&local_8c8);
  chrono::ChShaft::SetInertia(1.5);
  local_6f8 = local_6a8;
  p_Stack_6f0 = a_Stack_6a0[0]._M_pi;
  if (a_Stack_6a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_6a0[0]._M_pi)->_M_use_count = (a_Stack_6a0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_6a0[0]._M_pi)->_M_use_count = (a_Stack_6a0[0]._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::AddShaft(local_3b0,&local_6f8);
  if (p_Stack_6f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6f0);
  }
  local_8c8 = (ChShaft *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (&_Stack_8c0,&local_8c8,(allocator<chrono::ChShaft> *)&local_8f8);
  chrono::ChShaft::SetInertia(3.2);
  *(undefined8 *)(local_8c8 + 0x80) = 0xc014000000000000;
  local_818 = local_8c8;
  local_810 = _Stack_8c0._M_pi;
  if (_Stack_8c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_8c0._M_pi)->_M_use_count = (_Stack_8c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_8c0._M_pi)->_M_use_count = (_Stack_8c0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::AddShaft(local_3b0,&local_818);
  if (local_810 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_810);
  }
  local_8f8 = (ChShaft *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (a_Stack_8f0,&local_8f8,(allocator<chrono::ChShaft> *)&local_908);
  local_8f8[0x10c] = (ChShaft)0x1;
  local_8f8[0xd4] = (ChShaft)0x1;
  local_828 = local_8f8;
  local_820 = a_Stack_8f0[0]._M_pi;
  if (a_Stack_8f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::AddShaft(local_3b0,&local_828);
  if (local_820 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_820);
  }
  local_908 = (ChShaft *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (&_Stack_900,&local_908,(allocator<chrono::ChShaft> *)&local_8d8);
  local_908[0x10c] = (ChShaft)0x1;
  local_908[0xd4] = (ChShaft)0x1;
  local_838 = local_908;
  local_830 = _Stack_900._M_pi;
  if (_Stack_900._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::AddShaft(local_3b0,&local_838);
  if (local_830 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_830);
  }
  local_8d8 = (ChShaftsTorqueConverter *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsTorqueConverter,std::allocator<chrono::ChShaftsTorqueConverter>>
            (&_Stack_8d0,&local_8d8,(allocator<chrono::ChShaftsTorqueConverter> *)&local_8b8);
  local_708 = local_6a8;
  p_Stack_700 = a_Stack_6a0[0]._M_pi;
  if (a_Stack_6a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_6a0[0]._M_pi)->_M_use_count = (a_Stack_6a0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_6a0[0]._M_pi)->_M_use_count = (a_Stack_6a0[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_718 = local_8c8;
  p_Stack_710 = _Stack_8c0._M_pi;
  if (_Stack_8c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_8c0._M_pi)->_M_use_count = (_Stack_8c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_8c0._M_pi)->_M_use_count = (_Stack_8c0._M_pi)->_M_use_count + 1;
    }
  }
  local_728 = local_8f8;
  p_Stack_720 = a_Stack_8f0[0]._M_pi;
  if (a_Stack_8f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChShaftsTorqueConverter::Initialize(local_8d8,&local_708,&local_718,&local_728);
  if (p_Stack_720 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_720);
  }
  if (p_Stack_710 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_710);
  }
  if (p_Stack_700 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_700);
  }
  local_738 = local_8d8;
  p_Stack_730 = _Stack_8d0._M_pi;
  if (_Stack_8d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_8d0._M_pi)->_M_use_count = (_Stack_8d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_8d0._M_pi)->_M_use_count = (_Stack_8d0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b0,&local_738);
  if (p_Stack_730 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_730);
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00108c08;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)__libc_start_main;
  p_Var8 = &p_Var7[1]._M_use_count;
  p_Var7[2]._vptr__Sp_counted_base = (_func_int **)p_Var8;
  *(_Atomic_word **)&p_Var7[1]._M_use_count = p_Var8;
  p_Var7[2]._M_use_count = 0;
  p_Var7[2]._M_weak_count = 0;
  p_Var7[3]._vptr__Sp_counted_base = (_func_int **)p_Var8;
  chrono::ChFunction_Recorder::AddPoint(0.0,15.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.25,15.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.5,15.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.75,16.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.9,18.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(1.0,35.0,1.0);
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_8d8 + 0xa0) = p_Var7 + 1;
  local_6b8 = p_Var7 + 1;
  local_6b0._M_pi = p_Var7;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_8d8 + 0xa8),&local_6b0);
  if (local_6b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6b0._M_pi);
  }
  local_8e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var1 = local_8e0 + 1;
  p_Var8 = &local_8e0[1]._M_use_count;
  local_8e0->_M_use_count = 1;
  local_8e0->_M_weak_count = 1;
  local_8e0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00108c08;
  local_8e0[1]._vptr__Sp_counted_base = (_func_int **)__libc_start_main;
  local_8e0[2]._vptr__Sp_counted_base = (_func_int **)p_Var8;
  *(_Atomic_word **)&local_8e0[1]._M_use_count = p_Var8;
  local_8e0[2]._M_use_count = 0;
  local_8e0[2]._M_weak_count = 0;
  local_8e0[3]._vptr__Sp_counted_base = (_func_int **)p_Var8;
  chrono::ChFunction_Recorder::AddPoint(0.0,2.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.25,1.8,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.5,1.5,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.75,1.15,1.0);
  chrono::ChFunction_Recorder::AddPoint(1.0,1.0,1.0);
  local_6c0._M_pi = local_8e0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_8e0->_M_use_count = local_8e0->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_8e0->_M_use_count = local_8e0->_M_use_count + 1;
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_8d8 + 0xb0) = p_Var1;
  local_6c8 = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_8d8 + 0xb8),&local_6c0);
  if (local_6c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6c0._M_pi);
  }
  local_8b8 = (ChShaftsThermalEngine *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsThermalEngine,std::allocator<chrono::ChShaftsThermalEngine>>
            (a_Stack_8b0,&local_8b8,(allocator<chrono::ChShaftsThermalEngine> *)&local_898);
  local_748 = local_6a8;
  p_Stack_740 = a_Stack_6a0[0]._M_pi;
  if (a_Stack_6a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_6a0[0]._M_pi)->_M_use_count = (a_Stack_6a0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_6a0[0]._M_pi)->_M_use_count = (a_Stack_6a0[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_758 = local_908;
  p_Stack_750 = _Stack_900._M_pi;
  if (_Stack_900._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_8b8 + 0x1e8))(local_8b8,&local_748,&local_758);
  if (p_Stack_750 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_750);
  }
  if (p_Stack_740 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_740);
  }
  local_768 = local_8b8;
  p_Stack_760 = a_Stack_8b0[0]._M_pi;
  if (a_Stack_8b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_8b0[0]._M_pi)->_M_use_count = (a_Stack_8b0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_8b0[0]._M_pi)->_M_use_count = (a_Stack_8b0[0]._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b0,&local_768);
  if (p_Stack_760 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_760);
  }
  local_878 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var1 = local_878 + 1;
  p_Var8 = &local_878[1]._M_use_count;
  local_878->_M_use_count = 1;
  local_878->_M_weak_count = 1;
  local_878->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00108c08;
  local_878[1]._vptr__Sp_counted_base = (_func_int **)__libc_start_main;
  local_878[2]._vptr__Sp_counted_base = (_func_int **)p_Var8;
  *(_Atomic_word **)&local_878[1]._M_use_count = p_Var8;
  local_878[2]._M_use_count = 0;
  local_878[2]._M_weak_count = 0;
  local_878[3]._vptr__Sp_counted_base = (_func_int **)p_Var8;
  local_870 = p_Var7;
  chrono::ChFunction_Recorder::AddPoint(-5.0,30.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(0.0,30.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(200.0,60.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(400.0,40.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(450.0,0.0,1.0);
  chrono::ChFunction_Recorder::AddPoint(500.0,-60.0,1.0);
  local_6d0._M_pi = local_878;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_878->_M_use_count = local_878->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_878->_M_use_count = local_878->_M_use_count + 1;
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_8b8 + 0x90) = p_Var1;
  local_6d8 = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_8b8 + 0x98),&local_6d0);
  if (local_6d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6d0._M_pi);
  }
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n\n\nHere\'s the system hierarchy: \n\n ");
  iVar5 = chrono::GetLog();
  chrono::ChAssembly::ShowHierarchy(local_3a8,iVar5);
  local_8a0 = 0.0;
  while (local_8a0 < 4.5) {
    local_8a0 = local_8a0 + 0.01;
    chrono::ChSystem::DoFrameDynamics(local_8a0);
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"Time: ");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,local_8a0);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  shaft A rot: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_6a8 + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  speed: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_6a8 + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  accel: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_6a8 + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  shaft B rot: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_8c8 + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  speed: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_8c8 + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  accel: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_8c8 + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  T.Convert.:");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  R=");
    dVar11 = (double)chrono::ChShaftsTorqueConverter::GetSpeedRatio();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar11);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tin=");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_8d8 + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tout=");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_8d8 + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tstator=");
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)(local_8d8 + 0x98);
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar10 = vxorpd_avx512vl(auVar12,auVar2);
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,auVar10._0_8_ - *(double *)(local_8d8 + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  T.Motor: ");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  T(w)=");
    dVar11 = (double)(**(code **)(*(long *)local_8b8 + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar11);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"[Nm]");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  w=");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,*(double *)(*(long *)(local_8b8 + 0x78) + 0x90) -
                               *(double *)(*(long *)(local_8b8 + 0x80) + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"[rad/s]");
    chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_878);
  if (a_Stack_8b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_8b0[0]._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8e0);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_870);
  if (_Stack_8d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_8d0._M_pi);
  }
  if (_Stack_900._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_900._M_pi);
  }
  if (a_Stack_8f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_8f0[0]._M_pi);
  }
  if (_Stack_8c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_8c0._M_pi);
  }
  if (a_Stack_6a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_6a0[0]._M_pi);
  }
  chrono::ChSystem::~ChSystem((ChSystem *)local_3b0);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar6," Example 6: a ratcheting freewheel, as a one-directional clutch \n");
  chrono::ChSystemNSC::ChSystemNSC(local_3b0,true);
  local_8c8 = (ChShaft *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (&_Stack_8c0,&local_8c8,(allocator<chrono::ChShaft> *)&local_6a8);
  local_8c8[0x10c] = (ChShaft)0x1;
  local_8c8[0xd4] = (ChShaft)0x1;
  local_848 = local_8c8;
  local_840 = _Stack_8c0._M_pi;
  if (_Stack_8c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_8c0._M_pi)->_M_use_count = (_Stack_8c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_8c0._M_pi)->_M_use_count = (_Stack_8c0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::AddShaft(local_3b0,&local_848);
  if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840);
  }
  local_8f8 = (ChShaft *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (a_Stack_8f0,&local_8f8,(allocator<chrono::ChShaft> *)&local_6a8);
  chrono::ChShaft::SetInertia(1.5);
  local_778 = local_8f8;
  p_Stack_770 = a_Stack_8f0[0]._M_pi;
  if (a_Stack_8f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::AddShaft(local_3b0,&local_778);
  if (p_Stack_770 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_770);
  }
  local_908 = (ChShaft *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (&_Stack_900,&local_908,(allocator<chrono::ChShaft> *)&local_6a8);
  chrono::ChShaft::SetInertia(3.2);
  local_788 = local_908;
  p_Stack_780 = _Stack_900._M_pi;
  if (_Stack_900._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::AddShaft(local_3b0,&local_788);
  if (p_Stack_780 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_780);
  }
  local_8d8 = (ChShaftsTorqueConverter *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
            (&_Stack_8d0,(ChShaft **)&local_8d8,(allocator<chrono::ChShaft> *)&local_6a8);
  local_8d8[0x10c] = (ChShaftsTorqueConverter)0x1;
  local_8d8[0xd4] = (ChShaftsTorqueConverter)0x1;
  local_858 = local_8d8;
  local_850 = _Stack_8d0._M_pi;
  if (_Stack_8d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_8d0._M_pi)->_M_use_count = (_Stack_8d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_8d0._M_pi)->_M_use_count = (_Stack_8d0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::AddShaft(local_3b0,&local_858);
  if (local_850 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_850);
  }
  local_8b8 = (ChShaftsThermalEngine *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsMotorAngle,std::allocator<chrono::ChShaftsMotorAngle>>
            (a_Stack_8b0,(ChShaftsMotorAngle **)&local_8b8,
             (allocator<chrono::ChShaftsMotorAngle> *)&local_6a8);
  local_798 = local_8c8;
  p_Stack_790 = _Stack_8c0._M_pi;
  if (_Stack_8c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_8c0._M_pi)->_M_use_count = (_Stack_8c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_8c0._M_pi)->_M_use_count = (_Stack_8c0._M_pi)->_M_use_count + 1;
    }
  }
  local_7a8 = local_8f8;
  p_Stack_7a0 = a_Stack_8f0[0]._M_pi;
  if (a_Stack_8f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_8b8 + 0x1e8))(local_8b8,&local_798,&local_7a8);
  if (p_Stack_7a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7a0);
  }
  if (p_Stack_790 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_790);
  }
  local_7b8 = local_8b8;
  p_Stack_7b0 = a_Stack_8b0[0]._M_pi;
  if (a_Stack_8b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_8b0[0]._M_pi)->_M_use_count = (a_Stack_8b0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_8b0[0]._M_pi)->_M_use_count = (a_Stack_8b0[0]._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b0,&local_7b8);
  if (p_Stack_7b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7b0);
  }
  local_8e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  local_6e8 = local_8e0 + 1;
  local_8e0->_M_use_count = 1;
  local_8e0->_M_weak_count = 1;
  local_8e0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00108cf8;
  bVar9 = __libc_single_threaded == '\0';
  local_8e0[1]._vptr__Sp_counted_base = (_func_int **)chrono::ChShaftsTorqueConverter::Initialize;
  local_8e0[1]._M_use_count = 0x1242d434;
  local_8e0[1]._M_weak_count = 0x3fc43bf4;
  local_8e0[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_8e0[2]._M_use_count = 0x33333333;
  local_8e0[2]._M_weak_count = 0x3ff33333;
  local_8e0[3]._vptr__Sp_counted_base = (_func_int **)0x401e28c731eb6950;
  if (bVar9) {
    LOCK();
    local_8e0->_M_use_count = local_8e0->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_8e0->_M_use_count = 2;
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_8b8 + 0x88) = local_6e8;
  local_6e0._M_pi = local_8e0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_8b8 + 0x90),&local_6e0);
  if (local_6e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6e0._M_pi);
  }
  local_898 = (ChShaftsFreewheel *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsFreewheel,std::allocator<chrono::ChShaftsFreewheel>>
            (&local_890,&local_898,(allocator<chrono::ChShaftsFreewheel> *)&local_6a8);
  local_7c8 = local_8f8;
  p_Stack_7c0 = a_Stack_8f0[0]._M_pi;
  if (a_Stack_8f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_8f0[0]._M_pi)->_M_use_count = (a_Stack_8f0[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_7d8 = local_908;
  p_Stack_7d0 = _Stack_900._M_pi;
  if (_Stack_900._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_898 + 0x1e8))(local_898,&local_7c8,&local_7d8);
  if (p_Stack_7d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7d0);
  }
  if (p_Stack_7c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7c0);
  }
  *(long *)(local_898 + 0x88) = 0x3fd015bf9217271a;
  local_898[0x150] = (ChShaftsFreewheel)0x0;
  local_868 = local_898;
  local_860 = local_890._M_pi;
  if (local_890._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_890._M_pi)->_M_use_count = (local_890._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_890._M_pi)->_M_use_count = (local_890._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b0,&local_868);
  if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860);
  }
  local_888 = (ChShaftsClutch *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChShaftsClutch,std::allocator<chrono::ChShaftsClutch>>
            (&_Stack_880,&local_888,(allocator<chrono::ChShaftsClutch> *)&local_6a8);
  local_7e8 = local_908;
  p_Stack_7e0 = _Stack_900._M_pi;
  if (_Stack_900._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_900._M_pi)->_M_use_count = (_Stack_900._M_pi)->_M_use_count + 1;
    }
  }
  local_7f8 = local_8d8;
  p_Stack_7f0 = _Stack_8d0._M_pi;
  if (_Stack_8d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_8d0._M_pi)->_M_use_count = (_Stack_8d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_8d0._M_pi)->_M_use_count = (_Stack_8d0._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_888 + 0x1e8))(local_888,&local_7e8,&local_7f8);
  if (p_Stack_7f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7f0);
  }
  if (p_Stack_7e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_7e0);
  }
  chrono::ChShaftsClutch::SetTorqueLimit(-100.0,100.0);
  local_808 = local_888;
  p_Stack_800 = _Stack_880._M_pi;
  if (_Stack_880._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_880._M_pi)->_M_use_count = (_Stack_880._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_880._M_pi)->_M_use_count = (_Stack_880._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b0,&local_808);
  if (p_Stack_800 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_800);
  }
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n\n\nHere\'s the system hierarchy: \n\n ");
  iVar5 = chrono::GetLog();
  chrono::ChAssembly::ShowHierarchy(local_3a8,iVar5);
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
            ((ChStreamOutAsciiFile *)&local_6a8,"test_clutch.txt",0x20);
  local_8a0 = 0.0;
  while (local_8a0 < 5.5) {
    chrono::ChSystem::DoStepDynamics(0.01);
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"Time: ");
    local_8a0 = local_8a0 + 0.01;
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,local_8a0);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  shaft B rot: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_8f8 + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  speed: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_8f8 + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  accel: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_8f8 + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  shaft C rot: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_908 + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  speed: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_908 + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  accel: ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_908 + 0x98));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Torque: Tmotor=");
    dVar11 = (double)(**(code **)(*(long *)local_8b8 + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar11);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tfreewheel=");
    dVar11 = (double)(**(code **)(*(long *)local_898 + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar11);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  Tclutch=");
    dVar11 = (double)(**(code **)(*(long *)local_888 + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar11);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,"  ratchet vane=");
    dVar11 = 0.0;
    if (local_898[0x150] == (ChShaftsFreewheel)0x0) {
      if (local_898[0x160] == (ChShaftsFreewheel)0x1) {
        auVar13._0_8_ =
             (*(double *)(local_898 + 0x98) - *(double *)(local_898 + 0x158)) /
             *(double *)(local_898 + 0x88);
        auVar13._8_8_ = 0;
        auVar10 = vroundsd_avx(auVar13,auVar13,9);
        dVar11 = auVar10._0_8_;
      }
      else {
        auVar10._0_8_ =
             (*(double *)(local_898 + 0x158) - *(double *)(local_898 + 0x98)) /
             *(double *)(local_898 + 0x88);
        auVar10._8_8_ = 0;
        auVar10 = vroundsd_avx(auVar10,auVar10,9);
        auVar4._8_8_ = 0x8000000000000000;
        auVar4._0_8_ = 0x8000000000000000;
        auVar10 = vxorpd_avx512vl(auVar10,auVar4);
        dVar11 = auVar10._0_8_;
      }
    }
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar11);
    chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_3d8,local_8a0);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_8f8 + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_908 + 0x88));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar6,*(double *)(local_908 + 0x90));
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    dVar11 = (double)(**(code **)(*(long *)local_888 + 0x1f0))();
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar11);
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,", ");
    dVar11 = 0.0;
    if (local_898[0x150] == (ChShaftsFreewheel)0x0) {
      if (local_898[0x160] == (ChShaftsFreewheel)0x1) {
        auVar14._0_8_ =
             (*(double *)(local_898 + 0x98) - *(double *)(local_898 + 0x158)) /
             *(double *)(local_898 + 0x88);
        auVar14._8_8_ = 0;
        auVar10 = vroundsd_avx(auVar14,auVar14,9);
        dVar11 = auVar10._0_8_;
      }
      else {
        auVar15._0_8_ =
             (*(double *)(local_898 + 0x158) - *(double *)(local_898 + 0x98)) /
             *(double *)(local_898 + 0x88);
        auVar15._8_8_ = 0;
        auVar10 = vroundsd_avx(auVar15,auVar15,9);
        auVar3._8_8_ = 0x8000000000000000;
        auVar3._0_8_ = 0x8000000000000000;
        auVar10 = vxorpd_avx512vl(auVar10,auVar3);
        dVar11 = auVar10._0_8_;
      }
    }
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,dVar11);
    chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
  }
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)&local_6a8);
  if (_Stack_880._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_880._M_pi);
  }
  if (local_890._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_890._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8e0);
  if (a_Stack_8b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_8b0[0]._M_pi);
  }
  if (_Stack_8d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_8d0._M_pi);
  }
  if (_Stack_900._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_900._M_pi);
  }
  if (a_Stack_8f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_8f0[0]._M_pi);
  }
  if (_Stack_8c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_8c0._M_pi);
  }
  chrono::ChSystem::~ChSystem((ChSystem *)local_3b0);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    if (false) {
        //
        // EXAMPLE 1:
        //

        GetLog() << " Example: create a simple power train with ChShaft objects: \n";

        // We will model a very basic powertrain with two shafts A and B,
        // connected by a reducer [ t ] with transmission ratio 't'. Shafts are
        // free to rotate, shaft A has an applied torque Ta, so A and B will
        // constantly accelerate. Each shaft must have some inertia, it's like a
        // flywheel, marked as || in the following scheme:
        //
        //       A           B
        //  Ta  ||---[ t ]---||
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create a 1-degree-of-freedom '1D' mechanical object, that
        // is a ChShaft (an item that can oly rotate, with one inertia value
        // and maybe one applied torque). The ChShaft objects do not have
        // any meaning in 3d: they are just 'building blocks' for making
        // power trains as in imput-output black box schemes.
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(10);
        my_shaftA->SetAppliedTorque(6);
        sys.AddShaft(my_shaftA);

        // Create another shaft. Note that we use shared pointers for ChShaft
        // objects, as we did for ChBody objects. Also, note that we must add them
        // to the ChSystemNSC.
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(100);
        my_shaftB->SetShaftFixed(false);
        sys.AddShaft(my_shaftB);

        // Create a ChShaftsGear, that represents a simplified model
        // of a reducer, with transmission ratio t, between two ChShaft objects.
        // (Note that you could also build a 3D powertrain by creating full rigid bodies
        // of ChBody type and join them using ChLinkLockRevolute, ChLinkGear 3D constraints,
        // but this would introduce many unnecessary degrees of freedom/constraints
        // whereas the 1D items of ChShaft type, in this example, make things much simplier).
        auto my_shaft_gearAB = chrono_types::make_shared<ChShaftsGear>();
        my_shaft_gearAB->Initialize(my_shaftA, my_shaftB);
        my_shaft_gearAB->SetTransmissionRatio(-0.1);  // ex., a couple of spur gears with 20 and 200 teeth
        sys.Add(my_shaft_gearAB);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 2.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Print something on the console..

            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  shaft B  rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                     << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                     << "  AB gear, torque on A side: " << my_shaft_gearAB->GetTorqueReactionOn1()
                     << "  AB gear, torque on B side: " << my_shaft_gearAB->GetTorqueReactionOn2() << "\n";
        }
    }

    if (false) {
        //
        // EXAMPLE 2:
        //

        GetLog() << " Example: a clutch between two shafts \n";

        // We will model a very basic powertrain with two shafts A and B,
        // connected by a clutch [ c ]. Shafts (see flywheels || in scheme)
        // starts with nonzero speed, and are free to rotate independently
        // until the clutch is activated: since activation, they will decelerate
        // until they have the same speed.
        //
        //       A           B
        //  Ta  ||---[ c ]---||
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create a ChShaft that starts with nonzero angular velocity
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(0.5);
        my_shaftA->SetPos_dt(30);
        sys.AddShaft(my_shaftA);

        // Create another ChShaft, with opposite initial angular velocity
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(0.6);
        my_shaftB->SetPos_dt(-10);
        sys.AddShaft(my_shaftB);

        // Create a ChShaftsClutch, that represents a simplified model
        // of a clutch between two ChShaft objects (something that limits
        // the max transmitted torque, up to slippage).
        auto my_shaft_clutchAB = chrono_types::make_shared<ChShaftsClutch>();
        my_shaft_clutchAB->Initialize(my_shaftA, my_shaftB);
        my_shaft_clutchAB->SetTorqueLimit(60);
        sys.Add(my_shaft_clutchAB);

        // Let's begin the simulation with the clutch disengaged:
        my_shaft_clutchAB->SetModulation(0);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 1.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Activate the clutch only after 0.8 seconds of simulation:
            if (chronoTime > 0.8) {
                my_shaft_clutchAB->SetModulation(1);
            }

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  shaft B  rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                     << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                     << "  AB clutch, torque on A side: " << my_shaft_clutchAB->GetTorqueReactionOn1()
                     << "  AB clutch, torque on B side: " << my_shaft_clutchAB->GetTorqueReactionOn2() << "\n";
        }
    }

    if (false) {
        //
        // EXAMPLE 3:
        //

        GetLog() << " Example: an epicycloidal reducer \n";

        // We will model an epicycloidal reducer using the ChShaftsPlanetary
        // constraint.
        // The ChShaftsPlanetary makes a kinematic constraint between three
        // shafts: so one of them will be 'fixed' and will represent the truss
        // of the reducer -in s reducer, this is the role of the
        // large gear with inner teeth- and the two remaining shafts are the
        // input and output shafts (in other cases, such as the differential
        // planetary gear of the cars, all three shafts are free).
        // Also, a brake is applied for the output shaft: the ChShaftsClutch
        // will be used to this end, it's enough that one of the two shafts is fixed.
        // In the following scheme, the brake is [ b ], the planetary (the
        // reducer) is [ p ], the shafts are A,B,C,D applied torque is Ta, inertias
        // of free shafts are shown as flywheels || , and fixed shafts are marked with * .
        //
        //       A           B            D
        //  Ta  ||---[ p ]---||---[ b ]---*
        //           [   ]---*
        //                   C

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create shaft A, with applied torque
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(0.5);
        my_shaftA->SetAppliedTorque(10);
        sys.AddShaft(my_shaftA);

        // Create shaft B
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(0.5);
        sys.AddShaft(my_shaftB);

        // Create shaft C, that will be fixed (to be used as truss of epicycloidal reducer)
        auto my_shaftC = chrono_types::make_shared<ChShaft>();
        my_shaftC->SetShaftFixed(true);
        sys.AddShaft(my_shaftC);

        // Create a ChShaftsPlanetary, that represents a simplified model
        // of a planetary gear between THREE ChShaft objects (ex.: a car differential)
        // An epicycloidal reducer is a special type of planetary gear.
        auto my_shaft_planetaryBAC = chrono_types::make_shared<ChShaftsPlanetary>();
        my_shaft_planetaryBAC->Initialize(my_shaftB, my_shaftA, my_shaftC);  // output, carrier, fixed
        // We can set the ratios of the planetary using a simplified formula, for the
        // so called 'Willis' case. Imagine we hold fixed the carrier (shaft B in epic. reducers),
        // and leave free the truss C (the outer gear with inner teeth in our reducer); which is
        // the transmission ratio t0 that we get? It is simply t0=-Za/Zc, with Z = num of teeth of gears.
        // So just use the following to set all the three ratios automatically:
        double t0 =
            -50.0 / 100.0;  // suppose, in the reducer, that pinion A has 50 teeth and truss has 100 inner teeth.
        my_shaft_planetaryBAC->SetTransmissionRatioOrdinary(t0);
        sys.Add(my_shaft_planetaryBAC);

        // Now, let's make a shaft D, that is fixed, and used for the right side
        // of a clutch (so the clutch will act as a brake).
        auto my_shaftD = chrono_types::make_shared<ChShaft>();
        my_shaftD->SetShaftFixed(true);
        sys.Add(my_shaftD);

        // Make the brake. It is, in fact a clutch between shafts B and D, where
        // D is fixed as a truss, so the clutch will operate as a brake.
        auto my_shaft_clutchBD = chrono_types::make_shared<ChShaftsClutch>();
        my_shaft_clutchBD->Initialize(my_shaftB, my_shaftD);
        my_shaft_clutchBD->SetTorqueLimit(60);
        sys.Add(my_shaft_clutchBD);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 1.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  shaft B  rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                     << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                     << "  epicycloidal react torques on shafts - on A: "
                     << my_shaft_planetaryBAC->GetTorqueReactionOn2()
                     << " ,   on B: " << my_shaft_planetaryBAC->GetTorqueReactionOn1()
                     << " ,   on C: " << my_shaft_planetaryBAC->GetTorqueReactionOn3() << "\n";
        }
    }

    if (false) {
        //
        // EXAMPLE 4:
        //

        GetLog() << " Example: constraint between a ChBody and a ChShaft \n";

        // Suppose you want to create a 3D model, for instance a slider-crank,
        // built with multiple ChBody objects; moreover you want to create a
        // powertrain, for instance a motor, a clutch, etc, for the rotation of
        // the crank. How to connect the '1D items' of ChShaft class to the 3D
        // items of ChBody class? The solution is to use the ChShaftsBody constraint,
        // shown as [ bs ] in the following scheme, where the 3D body is shown as <>.
        // In this example we also add a 'torsional spring damper' C, shown as [ t ]
        // that connects shafts A and C (C is shown as * because fixed).
        //
        //        B             A           C
        //  Ta   <>---[ bs ]---||---[ t ]---*
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create 'A', a 1D shaft
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(9);
        sys.AddShaft(my_shaftA);

        // Create 'C', a 1D shaft, fixed
        auto my_shaftC = chrono_types::make_shared<ChShaft>();
        my_shaftC->SetShaftFixed(true);
        sys.AddShaft(my_shaftC);

        // Create 'B', a 3D rigid body
        auto my_bodyB = chrono_types::make_shared<ChBody>();
        my_bodyB->Accumulate_torque(ChVector<>(0, 0, 3), true);  // set some constant torque to body
        sys.Add(my_bodyB);

        // Make the torsional spring-damper between shafts A and C.
        auto my_shaft_torsionAC = chrono_types::make_shared<ChShaftsTorsionSpring>();
        my_shaft_torsionAC->Initialize(my_shaftA, my_shaftC);
        my_shaft_torsionAC->SetTorsionalStiffness(40);
        my_shaft_torsionAC->SetTorsionalDamping(0);
        sys.Add(my_shaft_torsionAC);

        // Make the shaft 'A' connected to the rotation of the 3D body 'B'.
        // We must specify the direction (in body coordinates) along which the
        // shaft will affect the body.
        auto my_shaftbody_connection = chrono_types::make_shared<ChShaftsBody>();
        ChVector<> mshaftdir(VECT_Z);
        my_shaftbody_connection->Initialize(my_shaftA, my_bodyB, mshaftdir);
        sys.Add(my_shaftbody_connection);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 0.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  Body B angular speed on z: " << my_bodyB->GetWvel_loc().z()
                     << "  accel on z: " << my_bodyB->GetWacc_loc().z() << "\n"
                     << "  AC spring, torque on A side: " << my_shaft_torsionAC->GetTorqueReactionOn1()
                     << "  torque on C side: " << my_shaft_torsionAC->GetTorqueReactionOn2() << "\n"
                     << "  shafts/body reaction,  on shaft A: " << my_shaftbody_connection->GetTorqueReactionOnShaft()
                     << " ,   on body (x y z): " << my_shaftbody_connection->GetTorqueReactionOnBody().x() << " "
                     << my_shaftbody_connection->GetTorqueReactionOnBody().y() << " "
                     << my_shaftbody_connection->GetTorqueReactionOnBody().z() << " "
                     << "\n";
        }
    }

    if (true) {
        //
        // EXAMPLE 5:
        //

        GetLog() << " Example 5: torque converter and thermal engine \n";

        // In this example we use a torque converter.
        // The torque converter is represented by a ChShaftsTorqueConverter
        // object, that connects three '1D items' of ChShaft class:
        // - the input shaft A, ie. the impeller connected to the engine
        // - the output shaft B, i.e. the turbine connected to the gears and wheels
        // - the stator C, that does not rotate and transmits reaction to the truss.
        // In the following scheme, the torque converter is represented as [ tc ],
        // and we also add a thermal engine, shown with [ e ], and a breaking torque Tb
        // (C is shown as * because fixed).
        //
        //   D           A             B
        //   *---[ e ]---||---[ tc ]---||  Tb
        //                    [    ]---*
        //                             C
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create 'A', a 1D shaft
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetInertia(1.5);
        sys.AddShaft(my_shaftA);

        // Create 'B', a 1D shaft
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(3.2);
        my_shaftB->SetAppliedTorque(-5);  // apply const braking torque
        sys.AddShaft(my_shaftB);

        // Create 'C', a 1D shaft, fixed
        auto my_shaftC = chrono_types::make_shared<ChShaft>();
        my_shaftC->SetShaftFixed(true);
        sys.AddShaft(my_shaftC);

        // Create 'D', a 1D shaft, fixed
        auto my_shaftD = chrono_types::make_shared<ChShaft>();
        my_shaftD->SetShaftFixed(true);
        sys.AddShaft(my_shaftD);

        // Make the torque converter and connect the shafts:
        // A (input),B (output), C(truss stator)
        auto my_torqueconverter = chrono_types::make_shared<ChShaftsTorqueConverter>();
        my_torqueconverter->Initialize(my_shaftA, my_shaftB, my_shaftC);
        sys.Add(my_torqueconverter);

        auto mK = chrono_types::make_shared<ChFunction_Recorder>();
        mK->AddPoint(0.0, 15);
        mK->AddPoint(0.25, 15);
        mK->AddPoint(0.50, 15);
        mK->AddPoint(0.75, 16);
        mK->AddPoint(0.90, 18);
        mK->AddPoint(1.00, 35);
        my_torqueconverter->SetCurveCapacityFactor(mK);

        auto mT = chrono_types::make_shared<ChFunction_Recorder>();
        mT->AddPoint(0.0, 2.00);
        mT->AddPoint(0.25, 1.80);
        mT->AddPoint(0.50, 1.50);
        mT->AddPoint(0.75, 1.15);
        mT->AddPoint(1.00, 1.00);
        my_torqueconverter->SetCurveTorqueRatio(mT);

        // Make the thermal engine, acting on shaft A, the input to
        // the torque converter. Note that the thermal engine also
        // requires another shaft D, that is used to transmit the
        // reaction torque back to a truss (the motor block).

        // Option A: use a ChShaftsMotor, in the MOT_MODE_TORQUE mode.
        //  It works, but most often this is more useful when in MOT_MODE_SPEED.
        /*
        auto my_motor = chrono_types::make_shared<ChShaftsMotor>();
        my_motor->Initialize(my_shaftA, my_shaftD);
        my_motor->SetMotorMode(ChShaftsMotor::MOT_MODE_TORQUE);
        my_motor->SetMotorTorque(30);
        sys.Add(my_motor);
        */

        // Option B: use a ChShaftsTorque, it just applies a torque
        // to my_shaftA (say, the crankshaft) and the negative torque
        // to my_shaftD (say, the motor block).
        // It is a quick approach. But you should take care of changing
        // the torque at each timestep if you want to simulate a torque curve...
        /*
        auto my_motor = chrono_types::make_shared<ChShaftsTorque>();
        my_motor->Initialize(my_shaftA, my_shaftD);
        my_motor->SetTorque(30);
        sys.Add(my_motor);
        */

        // Option C: a more powerful approach where you can
        // define a torque curve and a throttle value, using the
        // ChShaftsThermalEngine.

        auto my_motor = chrono_types::make_shared<ChShaftsThermalEngine>();
        my_motor->Initialize(my_shaftA, my_shaftD);
        sys.Add(my_motor);

        auto mTw = chrono_types::make_shared<ChFunction_Recorder>();
        mTw->AddPoint(-5, 30);  //   [rad/s],  [Nm]
        mTw->AddPoint(0, 30);
        mTw->AddPoint(200, 60);
        mTw->AddPoint(400, 40);
        mTw->AddPoint(450, 0);
        mTw->AddPoint(500, -60);  // torque curve must be defined beyond max speed too - engine might be 'pulled'
        my_motor->SetTorqueCurve(mTw);

        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        while (chronoTime < 4.5) {
            chronoTime += 0.01;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoFrameDynamics(chronoTime);

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                     << "  shaft A rot: " << my_shaftA->GetPos() << "  speed: " << my_shaftA->GetPos_dt()
                     << "  accel: " << my_shaftA->GetPos_dtdt() << "\n"
                     << "  shaft B rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                     << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                     << "  T.Convert.:"
                     << "  R=" << my_torqueconverter->GetSpeedRatio()
                     << "  Tin=" << my_torqueconverter->GetTorqueReactionOnInput()
                     << "  Tout=" << my_torqueconverter->GetTorqueReactionOnOutput()
                     << "  Tstator=" << my_torqueconverter->GetTorqueReactionOnStator() << "\n"
                     << "  T.Motor: "
                     << "  T(w)=" << my_motor->GetTorqueReactionOn1() << "[Nm]"
                     << "  w=" << my_motor->GetRelativeRotation_dt() << "[rad/s]"
                     << "\n";
        }
    }

    if (true) {
        //
        // EXAMPLE 6:
        //

        GetLog() << " Example 6: a ratcheting freewheel, as a one-directional clutch \n";

        // In this example we use a ratcheting freewheel, that acts as a one-directional 
        // clutch (where the locking in reverse direction happens only at discrete
        // steps, depending on the n.of ratcheting teeths).
        // The example consists of:
        // - the fixed shaft A
        // - the shaft B, that rotates back and forth 
        // - the shaft C, that rotates only unidirectionally
        // - the fixed shaft D
        // In the following scheme
        // - the freewheel is represented as [ fw ],
        // - we also add a motor, shown with [ m ], to generate sinusoidal rotation of B for testing
        // - we also add a clutch, shown with [ cl ], just to keep the shaft C "stopped" when not 
        //   pushed by the unidirectional freewheel, otherwise would proceed in one direction forever.
        // (A,D are shown as * because fixed).
        //
        //   A           B             C             D
        //   *---[ m ]---||---[ fw ]---||---[ cl ]---*
        //

        // The physical system: it contains all physical objects.
        ChSystemNSC sys;

        // Create 'A', a 1D shaft, fixed
        auto my_shaftA = chrono_types::make_shared<ChShaft>();
        my_shaftA->SetShaftFixed(true);
        sys.AddShaft(my_shaftA);

        // Create 'B', a 1D shaft
        auto my_shaftB = chrono_types::make_shared<ChShaft>();
        my_shaftB->SetInertia(1.5);
        sys.AddShaft(my_shaftB);

        // Create 'C', a 1D shaft
        auto my_shaftC = chrono_types::make_shared<ChShaft>();
        my_shaftC->SetInertia(3.2);
        sys.AddShaft(my_shaftC);

        // Create D', a 1D shaft, fixed
        auto my_shaftD = chrono_types::make_shared<ChShaft>();
        my_shaftD->SetShaftFixed(true);
        sys.AddShaft(my_shaftD);

        // Make the motor imposing a test sinusoidal rotation
        auto my_motor = chrono_types::make_shared<ChShaftsMotorAngle>();
        my_motor->Initialize(my_shaftA, my_shaftB);
        sys.Add(my_motor);
        auto my_sinefunction = chrono_types::make_shared<ChFunction_Sine>(0, 1.2,  0.001+0.5*CH_C_2PI / 20); // phase freq ampl
        my_motor->SetAngleFunction(my_sinefunction);

        // Make the freewheel:
        auto my_freewheel = chrono_types::make_shared<ChShaftsFreewheel>();
        my_freewheel->Initialize(my_shaftB, my_shaftC);
        my_freewheel->SetRatchetingModeTeeth(25);  
        //my_freewheel->SetJammingMode(); // this is like having infinite teeth, i.e. no backlash
        //my_freewheel->SetFreeBackward(); // this is to reverse the unidirectional behavior
        sys.Add(my_freewheel);

        // Make the clutch that keeps the shaft C in place:
        auto my_clutch = chrono_types::make_shared<ChShaftsClutch>();
        my_clutch->Initialize(my_shaftC, my_shaftD);
        my_clutch->SetTorqueLimit(100);
        sys.Add(my_clutch);


        GetLog() << "\n\n\nHere's the system hierarchy: \n\n ";
        sys.ShowHierarchy(GetLog());

        ChStreamOutAsciiFile file_results("test_clutch.txt");

        // Perform a very simple simulation loop..
        double chronoTime = 0;
        double step = 0.01;
        while (chronoTime < 5.5) {
            chronoTime += step;

            // PERFORM SIMULATION UP TO chronoTime
            sys.DoStepDynamics(step);

            // Print something on the console..
            GetLog() << "Time: " << chronoTime << "\n"
                << "  shaft B rot: " << my_shaftB->GetPos() << "  speed: " << my_shaftB->GetPos_dt()
                << "  accel: " << my_shaftB->GetPos_dtdt() << "\n"
                << "  shaft C rot: " << my_shaftC->GetPos() << "  speed: " << my_shaftC->GetPos_dt()
                << "  accel: " << my_shaftC->GetPos_dtdt() << "\n"
                << "  Torque: Tmotor=" << my_motor->GetTorqueReactionOn1()
                << "  Tfreewheel=" << my_freewheel->GetTorqueReactionOn1()
                << "  Tclutch=" << my_clutch->GetTorqueReactionOn1()
                << "  ratchet vane=" << my_freewheel->GetCurrentTeethVane()
                << "\n";
            file_results << chronoTime << ", " 
                << my_shaftB->GetPos() << ", " 
                << my_shaftC->GetPos() << ", " 
                << my_shaftC->GetPos_dt() << ", " 
                << my_clutch->GetTorqueReactionOn1() << ", " 
                << my_freewheel->GetCurrentTeethVane() << "\n";
        }
    }

    return 0;
}